

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::anon_unknown_3::verifyMultisampleLineGroupInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  RGBA RVar3;
  pointer pSVar4;
  RasterizationArguments *args_00;
  char cVar5;
  int i;
  int iVar6;
  CoverageType CVar7;
  long lVar8;
  ostream *poVar9;
  Surface *pSVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long lVar11;
  undefined8 uVar12;
  TextureFormat TVar13;
  ChannelOrder CVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  float sqSum;
  float fVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar26;
  float fVar27;
  float fVar28;
  Vec2 lineDir;
  RGBA color;
  Vec2 lineNormalDir;
  Vec2 lineScreenSpace [2];
  Vec2 viewportSize;
  Vector<float,_2> res_3;
  Vector<float,_2> res_10;
  TriangleSceneSpec triangleScene;
  Vector<float,_2> res_15;
  Vector<float,_2> res_11;
  Vector<float,_2> res_16;
  IVec2 viewportSize_1;
  Vector<float,_2> res_20;
  Vector<float,_2> res_17;
  Vector<float,_2> res_18;
  IVec3 pixelNativeColor;
  Vec2 lineNormalizedDeviceSpace [2];
  Vector<int,_3> res_42;
  Vector<float,_2> res_19;
  Vector<int,_3> res_39;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vec2 lineQuadScreenSpace [4];
  Vector<float,_3> res_52;
  Vector<float,_3> res_51;
  Vector<float,_3> res_49;
  Vector<float,_3> res_47;
  Vector<float,_3> res_48;
  Vector<float,_3> res_50;
  Vector<float,_3> res_45;
  Vector<float,_3> res_43;
  Vector<float,_3> res_44;
  Vector<float,_3> res_46;
  Vector<int,_3> res_41;
  ChannelType local_5e4;
  int local_5e0;
  int local_5dc;
  float afStack_5d0 [2];
  undefined1 local_5c8 [8];
  TextureFormat TStack_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  RGBA local_59c;
  undefined1 local_598 [8];
  size_type sStack_590;
  undefined1 local_588 [16];
  undefined1 local_578 [8];
  TextureFormat TStack_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  float local_550 [2];
  undefined1 local_548 [8];
  size_type sStack_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  undefined1 local_528 [8];
  size_type sStack_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  Surface *local_500;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_4f8;
  float local_4e0;
  int iStack_4dc;
  uint local_4d8;
  string local_4d0;
  Surface local_4b0;
  IVec2 local_498;
  float local_490 [4];
  Vector<int,_3> local_480;
  Vector<int,_3> local_470;
  Vector<int,_3> local_464;
  float local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  TextureFormat TStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  Vector<int,_3> local_3f0;
  float local_3e0 [4];
  float local_3d0 [4];
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  int local_3b0 [2];
  undefined1 local_3a8 [8];
  TextureFormat TStack_3a0;
  undefined1 local_398 [8];
  Vec2 local_390;
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [6];
  undefined1 local_318 [8];
  TextureFormat TStack_310;
  undefined1 local_308 [16];
  _Alloc_hider local_2f8;
  float afStack_2f0 [2];
  undefined1 local_2e8 [72];
  ios_base local_2a0 [264];
  RasterizationArguments *local_198;
  LineSceneSpec *local_190;
  Vector<float,_3> local_188;
  Vector<float,_3> local_178;
  float local_168 [4];
  float local_158 [4];
  float local_148 [4];
  Vector<float,_3> local_138;
  float local_128 [4];
  float local_118 [4];
  float local_108 [4];
  Vector<float,_3> local_f8;
  int local_e8 [3];
  float local_dc [6];
  float local_c4 [3];
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_84 [18];
  int local_3c [3];
  
  local_550[0] = (float)surface->m_width;
  local_550[1] = (float)surface->m_height;
  fVar26 = scene->lineWidth;
  local_4f8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_500 = surface;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&local_4f8,*(long *)&scene->field_0x8 - *(long *)scene >> 5);
  lVar8 = *(long *)scene;
  local_190 = scene;
  if (0 < (int)((ulong)(*(long *)&scene->field_0x8 - lVar8) >> 6)) {
    fVar26 = fVar26 * 0.5;
    lVar11 = 0;
    do {
      lVar17 = lVar11 * 0x40;
      fVar18 = *(float *)(lVar8 + 0xc + lVar17);
      local_438._4_4_ = *(float *)(lVar8 + 4 + lVar17) / fVar18;
      local_438._0_4_ = *(float *)(lVar8 + lVar17) / fVar18;
      fVar18 = *(float *)(lVar8 + 0x1c + lVar17);
      TStack_430.type = (ChannelType)(*(float *)(lVar8 + 0x14 + lVar17) / fVar18);
      TStack_430.order = (ChannelOrder)(*(float *)(lVar8 + 0x10 + lVar17) / fVar18);
      local_5c8._0_4_ = 1.0;
      local_5c8._4_4_ = 1.0;
      local_3a8._0_4_ = R;
      local_3a8._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_3a8 + lVar8 * 4) =
             *(float *)(local_438 + lVar8 * 4) + *(float *)(local_5c8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_318._0_4_ = R;
      local_318._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_318 + lVar8 * 4) = *(float *)(local_3a8 + lVar8 * 4) * 0.5;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_578._0_4_ = R;
      local_578._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_578 + lVar8 * 4) = *(float *)(local_318 + lVar8 * 4) * local_550[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_528 = (undefined1  [8])0x3f8000003f800000;
      local_548 = (undefined1  [8])0x0;
      lVar8 = 0;
      do {
        *(float *)(local_548 + lVar8 * 4) =
             (float)(&TStack_430.order)[lVar8] + *(float *)(local_528 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_598._0_4_ = 0.0;
      local_598._4_4_ = 0.0;
      lVar8 = 0;
      do {
        *(float *)(local_598 + lVar8 * 4) = *(float *)(local_548 + lVar8 * 4) * 0.5;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      TStack_570.order = R;
      TStack_570.type = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_578 + lVar8 * 4 + 8) = *(float *)(local_598 + lVar8 * 4) * local_550[lVar8]
        ;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_318._0_4_ = R;
      local_318._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_318 + lVar8 * 4) =
             *(float *)(local_578 + lVar8 * 4 + 8) - *(float *)(local_578 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      fVar18 = 0.0;
      lVar8 = 0;
      do {
        fVar18 = fVar18 + *(float *)(local_318 + lVar8 * 4) * *(float *)(local_318 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      if (fVar18 < 0.0) {
        fVar18 = sqrtf(fVar18);
        scene = local_190;
      }
      else {
        fVar18 = SQRT(fVar18);
      }
      local_5c8._0_4_ = R;
      local_5c8._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_5c8 + lVar8 * 4) = *(float *)(local_318 + lVar8 * 4) * (1.0 / fVar18);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_598 = (undefined1  [8])(CONCAT44(local_5c8._0_4_,local_5c8._4_4_) ^ 0x8000000000000000);
      local_3a8._0_4_ = R;
      local_3a8._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_3a8 + lVar8 * 4) = *(float *)(local_598 + lVar8 * 4) * fVar26;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_318._0_4_ = R;
      local_318._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_318 + lVar8 * 4) =
             *(float *)(local_578 + lVar8 * 4) + *(float *)(local_3a8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_548 = (undefined1  [8])0x0;
      lVar8 = 0;
      do {
        *(float *)(local_548 + lVar8 * 4) = *(float *)(local_598 + lVar8 * 4) * fVar26;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      TStack_310.order = R;
      TStack_310.type = SNORM_INT8;
      lVar8 = 0;
      do {
        (&TStack_310.order)[lVar8] =
             (ChannelOrder)(*(float *)(local_578 + lVar8 * 4) - *(float *)(local_548 + lVar8 * 4));
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_528 = (undefined1  [8])0x0;
      lVar8 = 0;
      do {
        *(float *)(local_528 + lVar8 * 4) = *(float *)(local_598 + lVar8 * 4) * fVar26;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_308._0_8_ = 0;
      lVar8 = 4;
      do {
        *(float *)(local_318 + lVar8 * 4) =
             *(float *)(local_588 + lVar8 * 4 + 8) - *(float *)((long)&local_538 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 5);
      local_4d0._M_dataplus._M_p = (pointer)0x0;
      lVar8 = 0;
      do {
        *(float *)((long)&local_4d0._M_dataplus._M_p + lVar8 * 4) =
             *(float *)(local_598 + lVar8 * 4) * fVar26;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_308._8_4_ = 0;
      local_308._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_308 + lVar8 * 4 + 8) =
             *(float *)(local_578 + lVar8 * 4 + 8) +
             *(float *)((long)&local_4d0._M_dataplus._M_p + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_528 = (undefined1  [8])0x0;
      lVar8 = 0;
      do {
        *(float *)(local_528 + lVar8 * 4) = *(float *)(local_318 + lVar8 * 4) / local_550[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_548 = (undefined1  [8])0x0;
      lVar8 = 0;
      do {
        *(float *)(local_548 + lVar8 * 4) =
             *(float *)(local_528 + lVar8 * 4) + *(float *)(local_528 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_4d0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
      local_3a8._0_4_ = R;
      local_3a8._4_4_ = SNORM_INT8;
      lVar8 = 0;
      do {
        *(float *)(local_3a8 + lVar8 * 4) =
             *(float *)(local_548 + lVar8 * 4) -
             *(float *)((long)&local_4d0._M_dataplus._M_p + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      _local_4e0 = 0;
      lVar8 = 0;
      do {
        (&local_4e0)[lVar8] = (float)(&TStack_310.order)[lVar8] / local_550[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_4b0.m_width = 0;
      local_4b0.m_height = 0;
      lVar8 = 0;
      do {
        (&local_4b0.m_width)[lVar8] = (int)((&local_4e0)[lVar8] + (&local_4e0)[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_464.m_data[0] = 0x3f800000;
      local_464.m_data[1] = 0x3f800000;
      TStack_3a0.order = R;
      TStack_3a0.type = SNORM_INT8;
      lVar8 = 0;
      do {
        (&TStack_3a0.order)[lVar8] =
             (ChannelOrder)((float)(&local_4b0.m_width)[lVar8] - (float)local_464.m_data[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_480.m_data[0] = 0;
      local_480.m_data[1] = 0;
      lVar8 = 0;
      do {
        local_480.m_data[lVar8] = (int)(*(float *)(local_308 + lVar8 * 4) / local_550[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_470.m_data[0] = 0;
      local_470.m_data[1] = 0;
      lVar8 = 0;
      do {
        local_470.m_data[lVar8] =
             (int)((float)local_480.m_data[lVar8] + (float)local_480.m_data[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_3d0[0] = 1.0;
      local_3d0[1] = 1.0;
      local_398._0_4_ = 0.0;
      local_398._4_4_ = 0.0;
      lVar8 = 0;
      do {
        *(float *)(local_398 + lVar8 * 4) = (float)local_470.m_data[lVar8] - local_3d0[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_3e0[0] = 0.0;
      local_3e0[1] = 0.0;
      lVar8 = 0;
      do {
        local_3e0[lVar8] = *(float *)(local_308 + lVar8 * 4 + 8) / local_550[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_490[0] = 0.0;
      local_490[1] = 0.0;
      lVar8 = 0;
      do {
        local_490[lVar8] = local_3e0[lVar8] + local_3e0[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_3f0.m_data[0] = 0x3f800000;
      local_3f0.m_data[1] = 0x3f800000;
      local_390.m_data[0] = 0.0;
      local_390.m_data[1] = 0.0;
      lVar8 = 0;
      do {
        local_390.m_data[lVar8] = local_490[lVar8] - (float)local_3f0.m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      lVar8 = (lVar11 << 0x21) >> 0x20;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[0].m_data[0] =
           (float)local_3a8._0_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[0].m_data[1] =
           (float)local_3a8._4_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[0].m_data[2] = 0.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[0].m_data[3] = 1.0;
      *(TextureFormat *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8].positions + 1) = TStack_3a0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[1].m_data[2] = 0.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[1].m_data[3] = 1.0;
      in_XMM3_Db = 0;
      in_XMM3_Dc = 0;
      in_XMM3_Dd = 0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[2].m_data[0] =
           (float)local_398._0_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[2].m_data[1] =
           (float)local_398._4_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[2].m_data[2] = 0.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].positions[2].m_data[3] = 1.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].sharedEdge[0] = false;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].sharedEdge[1] = false;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar8].sharedEdge[2] = true;
      puVar1 = (undefined8 *)(*(long *)scene + 0x20 + lVar17);
      uVar12 = puVar1[1];
      *(undefined8 *)
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar8].colors[0].m_data = *puVar1;
      *(undefined8 *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8].colors[0].m_data + 2) = uVar12;
      puVar1 = (undefined8 *)(*(long *)scene + 0x20 + lVar17);
      uVar12 = puVar1[1];
      *(undefined8 *)
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar8].colors[1].m_data = *puVar1;
      *(undefined8 *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8].colors[1].m_data + 2) = uVar12;
      puVar1 = (undefined8 *)(*(long *)scene + 0x30 + lVar17);
      uVar12 = puVar1[1];
      *(undefined8 *)
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar8].colors[2].m_data = *puVar1;
      *(undefined8 *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8].colors[2].m_data + 2) = uVar12;
      iVar6 = (int)lVar11 * 2 + 1;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[0] =
           (float)local_3a8._0_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[1] =
           (float)local_3a8._4_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[2] = 0.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[3] = 1.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[0] =
           (float)local_398._0_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[1] =
           (float)local_398._4_4_;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[2] = 0.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[3] = 1.0;
      *(float (*) [2])
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[2].m_data = local_390.m_data;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[2].m_data[2] = 0.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[2].m_data[3] = 1.0;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].sharedEdge[0] = true;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].sharedEdge[1] = false;
      local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].sharedEdge[2] = false;
      puVar1 = (undefined8 *)(*(long *)scene + 0x20 + lVar17);
      uVar12 = puVar1[1];
      *(undefined8 *)
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar6].colors[0].m_data = *puVar1;
      *(undefined8 *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar6].colors[0].m_data + 2) = uVar12;
      puVar1 = (undefined8 *)(*(long *)scene + 0x30 + lVar17);
      uVar12 = puVar1[1];
      *(undefined8 *)
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar6].colors[1].m_data = *puVar1;
      *(undefined8 *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar6].colors[1].m_data + 2) = uVar12;
      puVar1 = (undefined8 *)(*(long *)scene + 0x30 + lVar17);
      uVar12 = puVar1[1];
      *(undefined8 *)
       local_4f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar6].colors[2].m_data = *puVar1;
      *(undefined8 *)
       (local_4f8.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar6].colors[2].m_data + 2) = uVar12;
      lVar11 = lVar11 + 1;
      lVar8 = *(long *)scene;
    } while (lVar11 < (int)((ulong)(*(long *)&scene->field_0x8 - lVar8) >> 6));
  }
  local_3b0[1] = args->numSamples;
  local_498.m_data[0] = local_500->m_width;
  local_498.m_data[1] = local_500->m_height;
  iVar6 = args->subpixelBits;
  Surface::Surface(&local_4b0,local_498.m_data[0],local_498.m_data[1]);
  local_3a8._0_4_ = RGBA;
  local_3a8._4_4_ = UNORM_INT8;
  if ((void *)local_4b0.m_pixels.m_cap != (void *)0x0) {
    local_4b0.m_pixels.m_cap = (size_t)local_4b0.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_318,(TextureFormat *)local_3a8,local_4b0.m_width,
             local_4b0.m_height,1,(void *)local_4b0.m_pixels.m_cap);
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  TStack_3a0.order = R;
  TStack_3a0.type = 0x3f800000;
  tcu::clear((PixelBufferAccess *)local_318,(Vec4 *)local_3a8);
  local_318 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&TStack_310,"Verifying rasterization result. Native format is RGB",0x34);
  std::ostream::operator<<(&TStack_310,args->redBits);
  std::ostream::operator<<(&TStack_310,args->greenBits);
  std::ostream::operator<<(&TStack_310,args->blueBits);
  MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
  std::ios_base::~ios_base(local_2a0);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    local_318 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310,
               "Warning! More than 8 bits in a color channel, this may produce false negatives.",
               0x4f);
    MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
    std::ios_base::~ios_base(local_2a0);
  }
  if (iVar6 < 0) {
    local_318 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310,"Invalid subpixel count (",0x18);
    std::ostream::operator<<(&TStack_310,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"), assuming 0",0xd);
    MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
    std::ios_base::~ios_base(local_2a0);
    iVar6 = 0;
  }
  else if (0x10 < iVar6) {
    local_318 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310,"Subpixel count is greater than 16 (",0x23);
    std::ostream::operator<<(&TStack_310,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310,
               "). Checking results using less strict 16 bit requirements. This may produce false positives."
               ,0x5c);
    MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
    std::ios_base::~ios_base(local_2a0);
    iVar6 = 0x10;
  }
  if (local_500->m_height < 1) {
    local_5e0 = 0;
    local_5dc = 0;
  }
  else {
    local_5dc = 0;
    local_5e4 = SNORM_INT8;
    local_5e0 = 0;
    local_198 = args;
    local_3b0[0] = iVar6;
    pSVar10 = local_500;
    do {
      iVar6 = pSVar10->m_width;
      if (0 < iVar6) {
        uVar20 = 0;
        uVar22 = 0;
        uVar24 = 0;
        local_3bc = (float)(int)local_5e4;
        local_3c0 = (float)(int)local_5e4 + 1.0;
        CVar14 = R;
        do {
          local_59c.m_value =
               *(uint *)((long)(pSVar10->m_pixels).m_ptr +
                        (long)(int)(iVar6 * local_5e4 + CVar14) * 4);
          local_438._0_4_ = R;
          local_438._4_4_ = SNORM_INT8;
          TStack_430.order = R;
          TStack_430.type = SNORM_INT8;
          local_578._0_4_ = R;
          local_578._4_4_ = SNORM_INT8;
          TStack_570.order = R;
          TStack_570.type = SNORM_INT8;
          lVar8 = ((long)local_4f8.
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_4f8.
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
          local_3b4 = (float)(int)CVar14;
          local_3b8 = (float)(int)CVar14 + 1.0;
          local_458 = (float)((int)lVar8 - 1);
          iVar6 = 0;
          auVar2._12_4_ = 0;
          auVar2._0_12_ = local_448._4_12_;
          local_448 = auVar2 << 0x20;
          do {
            pSVar4 = local_4f8.
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = (int)lVar8 - 1;
            uVar21 = uVar20;
            uVar23 = uVar22;
            uVar25 = uVar24;
            if ((int)uVar16 < 0) break;
            local_318._4_4_ = local_5e4;
            local_318._0_4_ = CVar14;
            CVar7 = calculateTriangleCoverage
                              (local_4f8.
                               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].positions,
                               local_4f8.
                               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].positions + 1,
                               local_4f8.
                               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].positions + 2,
                               (IVec2 *)local_318,&local_498,local_3b0[0],local_3b0[1] != 0);
            if (CVar7 < COVERAGE_NONE) {
              local_a8._0_4_ = CVar7;
              local_98 = (float)CONCAT31(local_98._1_3_,CVar7 != COVERAGE_FULL);
              local_b8 = (ulong)(uint)local_458 * 100;
              local_3a8._4_4_ = local_3bc;
              local_3a8._0_4_ = local_3b4;
              TStack_3a0.type = (ChannelType)local_3c0;
              TStack_3a0.order = (ChannelOrder)local_3b4;
              local_398._4_4_ = local_3c0;
              local_398._0_4_ = local_3b8;
              local_390.m_data[1] = local_3bc;
              local_390.m_data[0] = local_3b8;
              lVar11 = *(long *)local_190;
              lVar17 = (ulong)(uVar16 >> 1) * 0x40;
              afStack_5d0[1] = *(float *)(lVar11 + 0xc + lVar17);
              fVar26 = *(float *)(lVar11 + 0x1c + lVar17);
              local_5c8._4_4_ =
                   (*(float *)(lVar11 + 4 + lVar17) / afStack_5d0[1] + 1.0) * 0.5 *
                   (float)local_498.m_data[1];
              local_5c8._0_4_ =
                   (*(float *)(lVar11 + lVar17) / afStack_5d0[1] + 1.0) * 0.5 *
                   (float)local_498.m_data[0];
              local_598._4_4_ =
                   (*(float *)(lVar11 + 0x14 + lVar17) / fVar26 + 1.0) * 0.5 *
                   (float)local_498.m_data[1];
              local_598._0_4_ =
                   (*(float *)(lVar11 + 0x10 + lVar17) / fVar26 + 1.0) * 0.5 *
                   (float)local_498.m_data[0];
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)local_318,(Vec2 *)local_5c8,afStack_5d0[1],
                         (Vec2 *)local_598,fVar26,(Vec2 *)local_3a8);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)local_308,(Vec2 *)local_5c8,afStack_5d0[1],
                         (Vec2 *)local_598,fVar26,(Vec2 *)&TStack_3a0);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)&local_2f8,(Vec2 *)local_5c8,afStack_5d0[1],
                         (Vec2 *)local_598,fVar26,(Vec2 *)local_398);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)local_2e8,(Vec2 *)local_5c8,afStack_5d0[1],
                         (Vec2 *)local_598,fVar26,&local_390);
              local_528 = (undefined1  [8])0x0;
              lVar11 = 0;
              do {
                uVar16 = -(uint)((float)(&TStack_310.order)[lVar11] <=
                                *(float *)(local_308 + lVar11 * 4 + 8));
                *(ChannelOrder *)(local_528 + lVar11 * 4) =
                     ~uVar16 & (uint)*(float *)(local_308 + lVar11 * 4 + 8) |
                     (&TStack_310.order)[lVar11] & uVar16;
                lVar11 = lVar11 + 1;
              } while (lVar11 == 1);
              local_4d0._M_dataplus._M_p = (pointer)0x0;
              lVar11 = 0;
              do {
                uVar16 = -(uint)(afStack_2f0[lVar11] <= *(float *)(local_2e8 + lVar11 * 4 + 8));
                *(uint *)((long)&local_4d0._M_dataplus._M_p + lVar11 * 4) =
                     ~uVar16 & (uint)*(float *)(local_2e8 + lVar11 * 4 + 8) |
                     (uint)afStack_2f0[lVar11] & uVar16;
                lVar11 = lVar11 + 1;
              } while (lVar11 == 1);
              local_548 = (undefined1  [8])0x0;
              lVar11 = 0;
              do {
                fVar26 = *(float *)((long)&local_4d0._M_dataplus._M_p + lVar11 * 4);
                uVar16 = -(uint)(*(float *)(local_528 + lVar11 * 4) <= fVar26);
                *(uint *)(local_548 + lVar11 * 4) =
                     ~uVar16 & (uint)fVar26 | (uint)*(float *)(local_528 + lVar11 * 4) & uVar16;
                lVar11 = lVar11 + 1;
              } while (lVar11 == 1);
              local_4d0._M_dataplus._M_p = (pointer)0x0;
              lVar11 = 0;
              do {
                uVar16 = -(uint)(*(float *)(local_308 + lVar11 * 4) <=
                                *(float *)(local_318 + lVar11 * 4));
                *(uint *)((long)&local_4d0._M_dataplus._M_p + lVar11 * 4) =
                     ~uVar16 & (uint)*(float *)(local_308 + lVar11 * 4) |
                     (uint)*(float *)(local_318 + lVar11 * 4) & uVar16;
                lVar11 = lVar11 + 1;
              } while (lVar11 == 1);
              _local_4e0 = 0;
              lVar11 = 0;
              do {
                uVar16 = -(uint)(*(float *)(local_2e8 + lVar11 * 4) <= afStack_2f0[lVar11 + -2]);
                (&local_4e0)[lVar11] =
                     (float)(~uVar16 & (uint)*(float *)(local_2e8 + lVar11 * 4) |
                            (uint)afStack_2f0[lVar11 + -2] & uVar16);
                lVar11 = lVar11 + 1;
              } while (lVar11 == 1);
              local_528 = (undefined1  [8])0x0;
              lVar11 = 0;
              do {
                fVar26 = *(float *)((long)&local_4d0._M_dataplus._M_p + lVar11 * 4);
                uVar16 = -(uint)((&local_4e0)[lVar11] <= fVar26);
                *(uint *)(local_528 + lVar11 * 4) =
                     ~uVar16 & (uint)(&local_4e0)[lVar11] | (uint)fVar26 & uVar16;
                lVar11 = lVar11 + 1;
              } while (lVar11 == 1);
              uVar20 = local_548._0_4_;
              uVar22 = local_548._4_4_;
              fVar26 = 1.0;
              if ((float)local_528._0_4_ <= 1.0) {
                fVar26 = (float)local_528._0_4_;
              }
              local_5c8._0_4_ = 0.0;
              local_5c8._4_4_ = 0.0;
              TStack_5c0.order = R;
              TStack_5c0.type = SNORM_INT8;
              lVar11 = 0;
              do {
                *(float *)(local_5c8 + lVar11 * 4) =
                     *(float *)((long)pSVar4->colors[0].m_data + lVar11 * 4 + local_b8) *
                     (float)(~-(uint)((float)local_528._0_4_ < 0.0) & (uint)fVar26);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              local_598._0_4_ = 0.0;
              local_598._4_4_ = 0.0;
              sStack_590 = 0;
              lVar11 = 0;
              do {
                *(float *)(local_598 + lVar11 * 4) =
                     *(float *)((long)pSVar4->colors[1].m_data + lVar11 * 4 + local_b8) * 0.0;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              local_3a8._0_4_ = R;
              local_3a8._4_4_ = SNORM_INT8;
              TStack_3a0.order = R;
              TStack_3a0.type = SNORM_INT8;
              lVar11 = 0;
              do {
                *(float *)(local_3a8 + lVar11 * 4) =
                     *(float *)(local_5c8 + lVar11 * 4) + *(float *)(local_598 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              fVar26 = 1.0;
              if ((float)local_528._4_4_ <= 1.0) {
                fVar26 = (float)local_528._4_4_;
              }
              local_548 = (undefined1  [8])0x0;
              sStack_540 = 0;
              lVar11 = 0;
              do {
                in_XMM3_Db = 0;
                in_XMM3_Dc = 0;
                in_XMM3_Dd = 0;
                *(float *)(local_548 + lVar11 * 4) =
                     *(float *)(pSVar4->sharedEdge + lVar11 * 4 + local_b8 + 0x50 + -0x60) *
                     (float)(~-(uint)((float)local_528._4_4_ < 0.0) & (uint)fVar26);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              local_318._0_4_ = R;
              local_318._4_4_ = SNORM_INT8;
              TStack_310.order = R;
              TStack_310.type = SNORM_INT8;
              lVar11 = 0;
              do {
                *(float *)(local_318 + lVar11 * 4) =
                     *(float *)(local_3a8 + lVar11 * 4) + *(float *)(local_548 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              fVar26 = 1.0;
              if ((float)uVar20 <= 1.0) {
                fVar26 = (float)uVar20;
              }
              local_598._0_4_ = 0.0;
              local_598._4_4_ = 0.0;
              sStack_590 = 0;
              lVar11 = 0;
              do {
                *(float *)(local_598 + lVar11 * 4) =
                     *(float *)((long)pSVar4->colors[0].m_data + lVar11 * 4 + local_b8) *
                     (float)(~-(uint)((float)uVar20 < 0.0) & (uint)fVar26);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              local_548 = (undefined1  [8])0x0;
              sStack_540 = 0;
              lVar11 = 0;
              do {
                *(float *)(local_548 + lVar11 * 4) =
                     *(float *)((long)pSVar4->colors[1].m_data + lVar11 * 4 + local_b8) * 0.0;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              local_5c8._0_4_ = R;
              local_5c8._4_4_ = SNORM_INT8;
              TStack_5c0.order = R;
              TStack_5c0.type = SNORM_INT8;
              lVar11 = 0;
              do {
                *(float *)(local_5c8 + lVar11 * 4) =
                     *(float *)(local_598 + lVar11 * 4) + *(float *)(local_548 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              fVar26 = 1.0;
              if ((float)uVar22 <= 1.0) {
                fVar26 = (float)uVar22;
              }
              local_528 = (undefined1  [8])0x0;
              sStack_520 = 0;
              lVar11 = 0;
              do {
                *(float *)(local_528 + lVar11 * 4) =
                     *(float *)(pSVar4->sharedEdge + lVar11 * 4 + local_b8 + 0x50 + -0x60) *
                     (float)(~-(uint)((float)uVar22 < 0.0) & (uint)fVar26);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              local_3a8._0_4_ = R;
              local_3a8._4_4_ = SNORM_INT8;
              TStack_3a0.order = R;
              TStack_3a0.type = SNORM_INT8;
              lVar11 = 0;
              do {
                *(float *)(local_3a8 + lVar11 * 4) =
                     *(float *)(local_5c8 + lVar11 * 4) + *(float *)(local_528 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              if (iVar6 == 0) {
                local_438 = local_3a8;
                TStack_430 = TStack_3a0;
                TVar13 = (TextureFormat)local_318;
                TStack_570 = TStack_310;
              }
              else {
                local_5c8._0_4_ = R;
                local_5c8._4_4_ = SNORM_INT8;
                TStack_5c0.order = R;
                TStack_5c0.type = SNORM_INT8;
                lVar11 = 0;
                do {
                  uVar16 = -(uint)(*(float *)(local_438 + lVar11 * 4) <=
                                  *(float *)(local_3a8 + lVar11 * 4));
                  *(uint *)(local_5c8 + lVar11 * 4) =
                       ~uVar16 & (uint)*(float *)(local_3a8 + lVar11 * 4) |
                       (uint)*(float *)(local_438 + lVar11 * 4) & uVar16;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 4);
                local_438 = local_5c8;
                TStack_430 = TStack_5c0;
                local_5c8._0_4_ = R;
                local_5c8._4_4_ = SNORM_INT8;
                TStack_5c0.order = R;
                TStack_5c0.type = SNORM_INT8;
                lVar11 = 0;
                do {
                  uVar16 = -(uint)(*(float *)(local_318 + lVar11 * 4) <=
                                  *(float *)(local_578 + lVar11 * 4));
                  *(uint *)(local_5c8 + lVar11 * 4) =
                       ~uVar16 & (uint)*(float *)(local_318 + lVar11 * 4) |
                       (uint)*(float *)(local_578 + lVar11 * 4) & uVar16;
                  lVar11 = lVar11 + 1;
                  TVar13 = (TextureFormat)local_5c8;
                  TStack_570 = TStack_5c0;
                } while (lVar11 != 4);
              }
              uVar24 = 0;
              uVar22 = 0;
              uVar20 = 0;
              local_578._0_4_ = TVar13.order;
              local_578._4_4_ = TVar13.type;
              iVar6 = iVar6 + 1;
              uVar16 = local_448._0_4_ & 0xff;
              if (local_a8._0_4_ == 0) {
                uVar16 = 1;
              }
              local_448._0_4_ = uVar16;
              cVar5 = local_98._0_1_;
            }
            else {
              cVar5 = '\x01';
            }
            lVar8 = lVar8 + -1;
            local_458 = (float)((int)local_458 - 1);
            uVar21 = uVar20;
            uVar23 = uVar22;
            uVar25 = uVar24;
          } while (cVar5 != '\0');
          uVar24 = in_XMM3_Dd;
          uVar22 = in_XMM3_Dc;
          uVar20 = in_XMM3_Db;
          args_00 = local_198;
          if (iVar6 == 0) {
            iVar6 = 0;
          }
          else if ((local_448 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            iVar6 = iVar6 + 1;
            local_438._0_4_ = R;
            local_438._4_4_ = SNORM_INT8;
            TStack_430.order = R;
            TStack_430.type = 0x3f800000;
          }
          in_XMM3_Db = uVar20;
          in_XMM3_Dc = uVar22;
          in_XMM3_Dd = uVar24;
          if (iVar6 == 0) {
            convertRGB8ToNativeFormat((anon_unknown_3 *)local_3a8,&local_59c,local_198);
            uVar20 = uVar21;
            uVar22 = uVar23;
            uVar24 = uVar25;
            if (((1 < (int)local_3a8._0_4_) || (1 < (int)local_3a8._4_4_)) ||
               (1 < (int)TStack_3a0.order)) {
              if (local_5dc + 1 < 4) {
                local_318 = (undefined1  [8])log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"Found an invalid pixel at (",0x1b);
                std::ostream::operator<<(&TStack_310,CVar14);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,",",1);
                std::ostream::operator<<(&TStack_310,local_5e4);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,")\n",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tPixel color:\t\t",0xf);
                RVar3.m_value = local_59c.m_value;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"RGBA(",5)
                ;
                poVar9 = (ostream *)std::ostream::operator<<(&TStack_310,RVar3.m_value & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,RVar3.m_value >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,RVar3.m_value >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,RVar3.m_value >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tExpected background color.\n",0x1c);
                MessageBuilder::operator<<
                          ((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
                std::ios_base::~ios_base(local_2a0);
                uVar20 = uVar21;
                uVar22 = uVar23;
                uVar24 = uVar25;
              }
              goto LAB_009419b1;
            }
          }
          else {
            local_318 = (undefined1  [8])local_438;
            TStack_310.order = R;
            TStack_310.type = SNORM_INT16;
            local_308._0_4_ = 2;
            local_3a8._0_4_ = R;
            local_3a8._4_4_ = SNORM_INT8;
            TStack_3a0 = (TextureFormat)((ulong)TStack_3a0 & 0xffffffff00000000);
            lVar8 = 2;
            do {
              local_3b0[lVar8] = *(int *)(local_438 + (long)*(int *)(local_318 + lVar8 * 4) * 4);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 5);
            local_318 = (undefined1  [8])local_578;
            TStack_310.order = R;
            TStack_310.type = SNORM_INT16;
            local_308._0_4_ = 2;
            local_308._0_8_ = CONCAT44(local_308._4_4_,local_308._0_4_);
            local_5c8._0_4_ = R;
            local_5c8._4_4_ = SNORM_INT8;
            TStack_5c0 = (TextureFormat)((ulong)TStack_5c0 & 0xffffffff00000000);
            lVar8 = 2;
            do {
              afStack_5d0[lVar8] = *(float *)(local_578 + (long)*(int *)(local_318 + lVar8 * 4) * 4)
              ;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 5);
            afStack_5d0[1] = (float)(iVar6 + -1);
            local_598._0_4_ = ~(-1 << ((byte)local_198->redBits & 0x1f));
            local_598._4_4_ = ~(-1 << ((byte)local_198->greenBits & 0x1f));
            uVar16 = ~(-1 << ((byte)local_198->blueBits & 0x1f));
            sStack_590 = CONCAT44(sStack_590._4_4_,uVar16);
            fVar26 = (float)(int)local_598._0_4_;
            fVar18 = (float)local_3a8._0_4_ * fVar26;
            local_548._0_4_ = fVar26;
            if (fVar18 <= fVar26) {
              local_548._0_4_ = fVar18;
            }
            local_548._0_4_ = ~-(uint)(fVar18 < 0.0) & local_548._0_4_;
            fVar18 = (float)(int)local_598._4_4_;
            fVar27 = (float)local_3a8._4_4_ * fVar18;
            fVar28 = fVar18;
            if (fVar27 <= fVar18) {
              fVar28 = fVar27;
            }
            local_98 = (float)(int)uVar16;
            local_548._4_4_ = ~-(uint)(fVar27 < 0.0) & (uint)fVar28;
            local_448 = ZEXT416((uint)local_548._4_4_);
            fVar28 = (float)TStack_3a0.order * local_98;
            local_458 = local_98;
            if (fVar28 <= local_98) {
              local_458 = fVar28;
            }
            local_458 = (float)(~-(uint)(fVar28 < 0.0) & (uint)local_458);
            sStack_540 = CONCAT44(sStack_540._4_4_,local_458);
            fVar28 = (float)local_5c8._0_4_ * fVar26;
            if (fVar28 <= fVar26) {
              fVar26 = fVar28;
            }
            local_528._0_4_ = ~-(uint)(fVar28 < 0.0) & (uint)fVar26;
            local_b8 = CONCAT44(uVar21,local_528._0_4_);
            fVar26 = (float)local_5c8._4_4_ * fVar18;
            if (fVar26 <= fVar18) {
              fVar18 = fVar26;
            }
            local_528._4_4_ = ~-(uint)(fVar26 < 0.0) & (uint)fVar18;
            local_a8 = ZEXT416((uint)local_528._4_4_);
            fVar26 = (float)TStack_5c0.order * local_98;
            if (fVar26 <= local_98) {
              local_98 = fVar26;
            }
            local_98 = (float)(~-(uint)(fVar26 < 0.0) & (uint)local_98);
            sStack_520 = CONCAT44(sStack_520._4_4_,local_98);
            uStack_454 = uVar20;
            uStack_450 = uVar22;
            uStack_44c = uVar24;
            uStack_b0 = uVar23;
            uStack_ac = uVar25;
            uStack_94 = uVar20;
            uStack_90 = uVar22;
            uStack_8c = uVar24;
            fVar18 = floorf((float)local_548._0_4_);
            fVar26 = floorf((float)local_448._0_4_);
            local_448._0_4_ = fVar26;
            fVar28 = floorf(local_458);
            iVar6 = (int)(float)local_448._0_4_;
            local_4d0._M_dataplus._M_p._4_4_ = iVar6;
            local_4d0._M_dataplus._M_p._0_4_ = (int)fVar18;
            local_4d0._M_string_length = CONCAT44(local_4d0._M_string_length._4_4_,(int)fVar28);
            fVar27 = ceilf((float)local_b8);
            local_458 = ceilf((float)local_a8._0_4_);
            fVar19 = ceilf(local_98);
            fVar26 = afStack_5d0[1];
            iVar15 = (int)local_458;
            local_4d8 = (uint)fVar19;
            _local_4e0 = CONCAT44(iVar15,(int)fVar27);
            local_458 = (float)local_4d8;
            convertRGB8ToNativeFormat((anon_unknown_3 *)&local_464,&local_59c,args_00);
            if (((local_464.m_data[0] < (int)fVar18 - (int)fVar26) ||
                (local_464.m_data[1] < iVar6 - (int)fVar26)) ||
               ((local_464.m_data[2] < (int)fVar28 - (int)fVar26 ||
                ((((int)fVar27 + (int)fVar26 < local_464.m_data[0] ||
                  (iVar15 + (int)fVar26 < local_464.m_data[1])) ||
                 ((int)local_458 + (int)fVar26 < local_464.m_data[2])))))) {
              if (local_5dc + 1 < 5) {
                local_318 = (undefined1  [8])log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"Found an invalid pixel at (",0x1b);
                std::ostream::operator<<(&TStack_310,CVar14);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,",",1);
                std::ostream::operator<<(&TStack_310,local_5e4);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,")\n",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tPixel color:\t\t",0xf);
                RVar3.m_value = local_59c.m_value;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"RGBA(",5)
                ;
                poVar9 = (ostream *)std::ostream::operator<<(&TStack_310,RVar3.m_value & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,RVar3.m_value >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,RVar3.m_value >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,RVar3.m_value >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tNative color:\t\t",0x10);
                tcu::operator<<((ostream *)&TStack_310,&local_464);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tAllowed error:\t\t",0x11);
                local_470.m_data[1] = (int)fVar26;
                local_470.m_data[0] = (int)fVar26;
                local_470.m_data[2] = (int)fVar26;
                tcu::operator<<((ostream *)&TStack_310,&local_470);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tReference native color min: ",0x1d);
                local_490[1] = fVar26;
                local_490[0] = fVar26;
                local_490[2] = fVar26;
                local_3d0[0] = 0.0;
                local_3d0[1] = 0.0;
                local_3d0[2] = 0.0;
                lVar8 = 0;
                do {
                  local_3d0[lVar8] =
                       (float)(*(int *)((long)&local_4d0._M_dataplus._M_p + lVar8 * 4) -
                              (int)local_490[lVar8]);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_3e0[0] = 0.0;
                local_3e0[1] = 0.0;
                local_3e0[2] = 0.0;
                local_480.m_data[2] = 0;
                local_480.m_data[0] = 0;
                local_480.m_data[1] = 0;
                lVar8 = 0;
                do {
                  fVar18 = local_3d0[lVar8];
                  fVar28 = *(float *)(local_598 + lVar8 * 4);
                  if ((int)fVar18 < (int)*(float *)(local_598 + lVar8 * 4)) {
                    fVar28 = fVar18;
                  }
                  if ((int)fVar18 < (int)local_3e0[lVar8]) {
                    fVar28 = local_3e0[lVar8];
                  }
                  local_480.m_data[lVar8] = (int)fVar28;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                tcu::operator<<((ostream *)&TStack_310,&local_480);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tReference native color max: ",0x1d);
                local_c4[0] = fVar26;
                local_c4[1] = fVar26;
                local_c4[2] = fVar26;
                local_e8[0] = 0;
                local_e8[1] = 0;
                local_e8[2] = 0;
                lVar8 = 0;
                do {
                  local_e8[lVar8] = (int)local_dc[lVar8 + 6] + (int)(&local_4e0)[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_3c[0] = 0;
                local_3c[1] = 0;
                local_3c[2] = 0;
                local_3f0.m_data[2] = 0;
                local_3f0.m_data[0] = 0;
                local_3f0.m_data[1] = 0;
                lVar8 = 0;
                do {
                  iVar6 = local_e8[lVar8];
                  iVar15 = *(int *)(local_598 + lVar8 * 4);
                  if (iVar6 < *(int *)(local_598 + lVar8 * 4)) {
                    iVar15 = iVar6;
                  }
                  if (iVar6 < local_3c[lVar8]) {
                    iVar15 = local_3c[lVar8];
                  }
                  local_3f0.m_data[lVar8] = iVar15;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                tcu::operator<<((ostream *)&TStack_310,&local_3f0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tReference native float min: ",0x1d);
                local_dc[3] = fVar26;
                local_dc[4] = fVar26;
                local_dc[5] = fVar26;
                local_118[0] = 0.0;
                local_118[1] = 0.0;
                local_118[2] = 0.0;
                lVar8 = 0;
                do {
                  local_118[lVar8] = (float)(int)local_dc[lVar8 + 3];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_108[2] = 0.0;
                local_108[0] = 0.0;
                local_108[1] = 0.0;
                lVar8 = 0;
                do {
                  local_108[lVar8] = *(float *)(local_548 + lVar8 * 4) - local_118[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_84[0xf] = 0.0;
                local_84[0x10] = 0.0;
                local_84[0x11] = 0.0;
                local_128[2] = 0.0;
                local_128[0] = 0.0;
                local_128[1] = 0.0;
                lVar8 = 0;
                do {
                  local_128[lVar8] = (float)*(int *)(local_598 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_f8.m_data[2] = 0.0;
                local_f8.m_data[0] = 0.0;
                local_f8.m_data[1] = 0.0;
                lVar8 = 0;
                do {
                  fVar18 = local_108[lVar8];
                  fVar28 = local_128[lVar8];
                  if (fVar18 <= local_128[lVar8]) {
                    fVar28 = fVar18;
                  }
                  uVar16 = -(uint)(fVar18 < local_84[lVar8 + 0xf]);
                  local_f8.m_data[lVar8] =
                       (float)(uVar16 & (uint)local_84[lVar8 + 0xf] | ~uVar16 & (uint)fVar28);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                tcu::operator<<((ostream *)&TStack_310,&local_f8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tReference native float max: ",0x1d);
                local_dc[0] = fVar26;
                local_dc[1] = fVar26;
                local_dc[2] = fVar26;
                local_158[0] = 0.0;
                local_158[1] = 0.0;
                local_158[2] = 0.0;
                lVar8 = 0;
                do {
                  local_158[lVar8] = (float)(int)local_dc[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_148[2] = 0.0;
                local_148[0] = 0.0;
                local_148[1] = 0.0;
                lVar8 = 0;
                do {
                  local_148[lVar8] = *(float *)(local_528 + lVar8 * 4) + local_158[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_84[0xc] = 0.0;
                local_84[0xd] = 0.0;
                local_84[0xe] = 0.0;
                local_168[2] = 0.0;
                local_168[0] = 0.0;
                local_168[1] = 0.0;
                lVar8 = 0;
                do {
                  local_168[lVar8] = (float)*(int *)(local_598 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_138.m_data[2] = 0.0;
                local_138.m_data[0] = 0.0;
                local_138.m_data[1] = 0.0;
                lVar8 = 0;
                do {
                  fVar26 = local_148[lVar8];
                  fVar18 = local_168[lVar8];
                  if (fVar26 <= local_168[lVar8]) {
                    fVar18 = fVar26;
                  }
                  uVar16 = -(uint)(fVar26 < local_84[lVar8 + 0xc]);
                  local_138.m_data[lVar8] =
                       (float)(uVar16 & (uint)local_84[lVar8 + 0xc] | ~uVar16 & (uint)fVar18);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                tcu::operator<<((ostream *)&TStack_310,&local_138);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tFmin:\t",7);
                local_84[9] = 0.0;
                local_84[10] = 0.0;
                local_84[0xb] = 0.0;
                local_84[6] = 1.0;
                local_84[7] = 1.0;
                local_84[8] = 1.0;
                local_178.m_data[2] = 0.0;
                local_178.m_data[0] = 0.0;
                local_178.m_data[1] = 0.0;
                lVar8 = 0;
                do {
                  fVar26 = *(float *)(local_3a8 + lVar8 * 4);
                  fVar18 = local_84[lVar8 + 6];
                  if (fVar26 <= local_84[lVar8 + 6]) {
                    fVar18 = fVar26;
                  }
                  uVar16 = -(uint)(fVar26 < local_84[lVar8 + 9]);
                  local_178.m_data[lVar8] =
                       (float)(uVar16 & (uint)local_84[lVar8 + 9] | ~uVar16 & (uint)fVar18);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                tcu::operator<<((ostream *)&TStack_310,&local_178);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&TStack_310,"\tFmax:\t",7);
                local_84[3] = 0.0;
                local_84[4] = 0.0;
                local_84[5] = 0.0;
                local_84[0] = 1.0;
                local_84[1] = 1.0;
                local_84[2] = 1.0;
                local_188.m_data[2] = 0.0;
                local_188.m_data[0] = 0.0;
                local_188.m_data[1] = 0.0;
                lVar8 = 0;
                do {
                  fVar26 = *(float *)(local_5c8 + lVar8 * 4);
                  uVar20 = 0;
                  uVar22 = 0;
                  uVar24 = 0;
                  fVar18 = local_84[lVar8];
                  if (fVar26 <= local_84[lVar8]) {
                    fVar18 = fVar26;
                  }
                  uVar16 = -(uint)(fVar26 < local_84[lVar8 + 3]);
                  in_XMM3_Db = 0;
                  in_XMM3_Dc = 0;
                  in_XMM3_Dd = 0;
                  local_188.m_data[lVar8] =
                       (float)(uVar16 & (uint)local_84[lVar8 + 3] | ~uVar16 & (uint)fVar18);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                tcu::operator<<((ostream *)&TStack_310,&local_188);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"\n",1);
                MessageBuilder::operator<<
                          ((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
                std::ios_base::~ios_base(local_2a0);
              }
LAB_009419b1:
              local_5e0 = local_5e0 + 1;
              local_5dc = local_5dc + 1;
              *(undefined4 *)
               ((long)local_4b0.m_pixels.m_ptr +
               (long)(int)(local_4b0.m_width * local_5e4 + CVar14) * 4) = 0xff0000ff;
            }
          }
          CVar14 = CVar14 + A;
          iVar6 = local_500->m_width;
          pSVar10 = local_500;
        } while ((int)CVar14 < iVar6);
      }
      local_5e4 = local_5e4 + SNORM_INT16;
    } while ((int)local_5e4 < pSVar10->m_height);
  }
  if (4 < local_5dc) {
    local_318 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_310,"Omitted ",8);
    std::ostream::operator<<(&TStack_310,local_5dc + -4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310," pixel error description(s).",0x1c);
    MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
    std::ios_base::~ios_base(local_2a0);
  }
  iVar6 = (int)log;
  if (local_5e0 == 0) {
    local_318 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310,"No invalid pixels found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
    std::ios_base::~ios_base(local_2a0);
    local_318._0_4_ = S;
    local_318._4_4_ = SNORM_INT8;
    local_438 = (undefined1  [8])&local_428;
    local_438 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_318);
    local_428._M_allocated_capacity = (size_type)local_318;
    *(undefined8 *)local_438 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
    TStack_430.order = local_318._0_4_;
    TStack_430.type = local_318._4_4_;
    *(char *)((long)local_438 + (long)local_318) = '\0';
    local_318._0_4_ = S;
    local_318._4_4_ = SNORM_INT8;
    local_578 = (undefined1  [8])((long)local_578 + 0x10);
    local_578 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_578,(ulong)local_318);
    local_568._M_allocated_capacity = (size_type)local_318;
    *(undefined8 *)local_578 = 0x6f20746c75736552;
    builtin_strncpy((char *)((long)local_578 + 8),"f render",8);
    builtin_strncpy((char *)((long)local_578 + 0xf),"ring",4);
    TStack_570.order = local_318._0_4_;
    TStack_570.type = local_318._4_4_;
    *(char *)((long)local_578 + (long)local_318) = '\0';
    LogImageSet::LogImageSet((LogImageSet *)local_3a8,(string *)local_438,(string *)local_578);
    TestLog::startImageSet(log,(char *)local_3a8,local_388._M_p);
    TStack_5c0.order = RA;
    TStack_5c0.type = SNORM_INT8;
    local_5b8._M_allocated_capacity._0_7_ = 0x746c75736552;
    local_588._0_4_ = 0x75736552;
    local_588._4_2_ = 0x746c;
    sStack_590 = 6;
    local_588[6] = '\0';
    pSVar10 = local_500;
    local_5c8 = (undefined1  [8])&local_5b8;
    local_598 = (undefined1  [8])local_588;
    LogImage::LogImage((LogImage *)local_318,(string *)local_5c8,(string *)local_598,local_500,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_318,iVar6,__buf_01,(size_t)pSVar10);
    TestLog::endImageSet(log);
    if (local_2f8._M_p != local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._0_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,
                      CONCAT17(local_588[7],
                               CONCAT16(local_588[6],CONCAT24(local_588._4_2_,local_588._0_4_))) + 1
                     );
    }
    if (local_5c8 != (undefined1  [8])&local_5b8) {
      operator_delete((void *)local_5c8,(ulong)(local_5b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_p != local_378) {
      operator_delete(local_388._M_p,local_378[0]._M_allocated_capacity + 1);
    }
    if (local_3a8 != (undefined1  [8])local_398) {
      operator_delete((void *)local_3a8,(long)local_398 + 1);
    }
    if (local_578 != (undefined1  [8])((long)local_578 + 0x10)) {
      operator_delete((void *)local_578,(ulong)(local_568._M_allocated_capacity + 1));
    }
    uVar12 = local_428._M_allocated_capacity;
    TVar13 = (TextureFormat)local_438;
    if (local_438 == (undefined1  [8])&local_428) goto LAB_00942174;
  }
  else {
    local_318 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_310);
    std::ostream::operator<<(&TStack_310,local_5e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_310," invalid pixel(s) found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_318,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_310);
    std::ios_base::~ios_base(local_2a0);
    local_318._0_4_ = S;
    local_318._4_4_ = SNORM_INT8;
    local_578 = (undefined1  [8])((long)local_578 + 0x10);
    local_578 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_578,(ulong)local_318);
    local_568._M_allocated_capacity = (size_type)local_318;
    *(undefined8 *)local_578 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_578 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_578 + 0xf),"sult",4);
    TStack_570.order = local_318._0_4_;
    TStack_570.type = local_318._4_4_;
    *(char *)((long)local_578 + (long)local_318) = '\0';
    local_5c8 = (undefined1  [8])&local_5b8;
    local_318._0_4_ = S;
    local_318._4_4_ = SNORM_INT8;
    local_5c8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_5c8,(ulong)local_318);
    local_5b8._M_allocated_capacity = (size_type)local_318;
    *(undefined8 *)local_5c8 = 0x6f20746c75736552;
    builtin_strncpy((char *)((long)local_5c8 + 8),"f render",8);
    builtin_strncpy((char *)((long)local_5c8 + 0xf),"ring",4);
    TStack_5c0.order = local_318._0_4_;
    TStack_5c0.type = local_318._4_4_;
    *(char *)((long)local_5c8 + (long)local_318) = '\0';
    LogImageSet::LogImageSet((LogImageSet *)local_438,(string *)local_578,(string *)local_5c8);
    TestLog::startImageSet(log,(char *)local_438,local_418._M_p);
    local_588._0_4_ = 0x75736552;
    local_588._4_2_ = 0x746c;
    sStack_590 = 6;
    local_588[6] = '\0';
    local_538._M_allocated_capacity._0_4_ = 0x75736552;
    local_538._M_allocated_capacity._4_2_ = 0x746c;
    sStack_540 = 6;
    local_538._M_local_buf[6] = '\0';
    pSVar10 = local_500;
    local_598 = (undefined1  [8])local_588;
    local_548 = (undefined1  [8])&local_538;
    LogImage::LogImage((LogImage *)local_318,(string *)local_598,(string *)local_548,local_500,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_318,iVar6,__buf,(size_t)pSVar10);
    local_518._M_allocated_capacity = 0x73614d726f727245;
    local_518._8_2_ = 0x6b;
    sStack_520 = 9;
    local_4d0.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_4d0.field_2._8_2_ = 0x6b;
    local_4d0._M_string_length = 9;
    pSVar10 = &local_4b0;
    local_528 = (undefined1  [8])&local_518;
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    LogImage::LogImage((LogImage *)local_3a8,(string *)local_528,&local_4d0,pSVar10,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_3a8,iVar6,__buf_00,(size_t)pSVar10);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_p != local_378) {
      operator_delete(local_388._M_p,local_378[0]._M_allocated_capacity + 1);
    }
    if (local_3a8 != (undefined1  [8])local_398) {
      operator_delete((void *)local_3a8,(long)local_398 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if (local_528 != (undefined1  [8])&local_518) {
      operator_delete((void *)local_528,local_518._M_allocated_capacity + 1);
    }
    if (local_2f8._M_p != local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._0_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    if (local_548 != (undefined1  [8])&local_538) {
      operator_delete((void *)local_548,
                      CONCAT17(local_538._M_local_buf[7],
                               CONCAT16(local_538._M_local_buf[6],
                                        CONCAT24(local_538._M_allocated_capacity._4_2_,
                                                 local_538._M_allocated_capacity._0_4_))) + 1);
    }
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,
                      CONCAT17(local_588[7],
                               CONCAT16(local_588[6],CONCAT24(local_588._4_2_,local_588._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
    }
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    if (local_5c8 != (undefined1  [8])&local_5b8) {
      operator_delete((void *)local_5c8,(ulong)(local_5b8._M_allocated_capacity + 1));
    }
    uVar12 = local_568._M_allocated_capacity;
    TVar13 = (TextureFormat)local_578;
    if (local_578 == (undefined1  [8])((long)local_578 + 0x10)) goto LAB_00942174;
  }
  operator_delete((void *)TVar13,(ulong)(uVar12 + 1));
LAB_00942174:
  Surface::~Surface(&local_4b0);
  if (local_4f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4f8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_5e0 == 0;
}

Assistant:

bool verifyMultisampleLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		const tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};
		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);

		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 0].colors[0] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 0].colors[1] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 0].colors[2] = scene.lines[lineNdx].colors[1];

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);

		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;

		triangleScene.triangles[lineNdx*2 + 1].colors[0] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 1].colors[1] = scene.lines[lineNdx].colors[1];
		triangleScene.triangles[lineNdx*2 + 1].colors[2] = scene.lines[lineNdx].colors[1];
	}

	return verifyTriangleGroupInterpolationWithInterpolator(surface, triangleScene, args, log, MultisampleLineInterpolator(scene));
}